

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> *
spvtools::val::anon_unknown_0::getStructMembers
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          uint32_t struct_id,Op type,ValidationState_t *vstate)

{
  iterator __position;
  uint32_t *puVar1;
  Instruction *pIVar2;
  undefined4 in_register_00000014;
  uint32_t *puVar3;
  uint id;
  uint32_t local_4c;
  uint32_t *local_48;
  uint32_t *puStack_40;
  long local_38;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pIVar2 = ValidationState_t::FindDef
                     ((ValidationState_t *)CONCAT44(in_register_00000014,type),struct_id);
  local_38 = 0;
  local_48 = (uint32_t *)0x0;
  puStack_40 = (uint32_t *)0x0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  _M_range_initialize<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,
             (pIVar2->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start + 2,
             (pIVar2->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  puVar1 = puStack_40;
  if (local_48 != puStack_40) {
    puVar3 = local_48;
    do {
      local_4c = *puVar3;
      pIVar2 = ValidationState_t::FindDef
                         ((ValidationState_t *)CONCAT44(in_register_00000014,type),local_4c);
      if ((pIVar2->inst_).opcode == 0x1e) {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                     __position,&local_4c);
        }
        else {
          *__position._M_current = local_4c;
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar1);
  }
  if (local_48 != (uint32_t *)0x0) {
    operator_delete(local_48,local_38 - (long)local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> getStructMembers(uint32_t struct_id, spv::Op type,
                                       ValidationState_t& vstate) {
  std::vector<uint32_t> members;
  for (auto id : getStructMembers(struct_id, vstate)) {
    if (type == vstate.FindDef(id)->opcode()) {
      members.push_back(id);
    }
  }
  return members;
}